

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

int Vta_ManObjIsUsed(Vta_Man_t *p,int iObj)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = Vec_IntEntryP(p->vSeens,iObj * p->nWords);
  lVar3 = 0;
  do {
    if (p->nWords <= lVar3) {
      return 0;
    }
    piVar1 = piVar2 + lVar3;
    lVar3 = lVar3 + 1;
  } while (*piVar1 == 0);
  return 1;
}

Assistant:

int Vta_ManObjIsUsed( Vta_Man_t * p, int iObj )
{
    int i;
    unsigned * pInfo = (unsigned *)Vec_IntEntryP( p->vSeens, p->nWords * iObj );
    for ( i = 0; i < p->nWords; i++ )
        if ( pInfo[i] )
            return 1;
    return 0;
}